

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

FlattenLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::FlattenLayerParams>
          (Arena *arena)

{
  FlattenLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (FlattenLayerParams *)operator_new(0x18);
    CoreML::Specification::FlattenLayerParams::FlattenLayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (FlattenLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x18,(type_info *)&CoreML::Specification::FlattenLayerParams::typeinfo);
    CoreML::Specification::FlattenLayerParams::FlattenLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }